

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O2

void __thiscall
ASCFile::parse_format
          (ASCFile *this,char **p,char **s,char **arena,char **arena_end,line_iterator_t *line_it)

{
  double dVar1;
  double dVar2;
  value_type local_18;
  
  if (this->m_firstformat == true) {
    line_it->_M_current = line_it->_M_current + 7;
    this->m_firstformat = false;
  }
  else {
    dVar1 = strtod(*p,p);
    dVar2 = strtod(*p,p);
    local_18.y = (int)(dVar2 * 1000.0);
    local_18.x = (int)(dVar1 * 1000.0);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
              (&(this->super_BRDFileBase).format,&local_18);
  }
  return;
}

Assistant:

void ASCFile::parse_format(char *&p, char *&s, char *&arena, char *&arena_end, line_iterator_t &line_it) {
	if (m_firstformat) {
		line_it += 7; // Skip 7+1 unused lines before 1st point. Might not work with all files.
		m_firstformat = false;
		return; // lines++ in while loop
	}
	BRDPoint point;

	double x = READ_DOUBLE();
	point.x  = x * 1000.0f; // OBV uses integers
	double y = READ_DOUBLE();
	point.y  = y * 1000.0f;
	format.push_back(point);
}